

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void vkb::detail::setup_pNext_chain<VkInstanceCreateInfo>
               (VkInstanceCreateInfo *structure,
               vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *structs)

{
  value_type pVVar1;
  pointer ppVVar2;
  const_reference ppVVar3;
  pointer ppVVar4;
  ulong __n;
  
  structure->pNext = (void *)0x0;
  ppVVar4 = (structs->
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppVVar2 = (structs->
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppVVar2 != ppVVar4) {
    __n = 0;
    while (__n < ((long)ppVVar2 - (long)ppVVar4 >> 3) - 1U) {
      ppVVar3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::at
                          (structs,__n + 1);
      pVVar1 = *ppVVar3;
      ppVVar3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::at
                          (structs,__n);
      (*ppVVar3)->pNext = pVVar1;
      ppVVar4 = (structs->
                super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      __n = __n + 1;
      ppVVar2 = (structs->
                super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    ppVVar3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::at
                        (structs,0);
    structure->pNext = *ppVVar3;
  }
  return;
}

Assistant:

void setup_pNext_chain(T& structure, std::vector<VkBaseOutStructure*> const& structs) {
    structure.pNext = nullptr;
    if (structs.size() <= 0) return;
    for (size_t i = 0; i < structs.size() - 1; i++) {
        structs.at(i)->pNext = structs.at(i + 1);
    }
    structure.pNext = structs.at(0);
}